

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfVecAttribute.cpp
# Opt level: O1

void __thiscall
Imf_3_4::TypedAttribute<Imath_3_2::Vec3<float>_>::writeValueTo
          (TypedAttribute<Imath_3_2::Vec3<float>_> *this,OStream *os,int version)

{
  float local_1c;
  float local_18;
  float local_14;
  
  local_1c = (this->_value).x;
  (*os->_vptr_OStream[2])(os,&local_1c,4);
  local_18 = (this->_value).y;
  (*os->_vptr_OStream[2])(os,&local_18,4);
  local_14 = (this->_value).z;
  (*os->_vptr_OStream[2])(os,&local_14,4);
  return;
}

Assistant:

IMF_EXPORT void
V3fAttribute::writeValueTo (
    OPENEXR_IMF_INTERNAL_NAMESPACE::OStream& os, int version) const
{
    Xdr::write<StreamIO> (os, _value.x);
    Xdr::write<StreamIO> (os, _value.y);
    Xdr::write<StreamIO> (os, _value.z);
}